

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

char16 * Js::JavascriptString::AllocateLeafAndCopySz
                   (Recycler *recycler,char16 *content,charcount_t length)

{
  Recycler *this;
  TrackAllocData local_50;
  char16_t *local_28;
  char16 *buffer;
  charcount_t bufLen;
  charcount_t length_local;
  char16 *content_local;
  Recycler *recycler_local;
  
  buffer._4_4_ = length;
  _bufLen = content;
  content_local = (char16 *)recycler;
  if (0x7ffffffd < length) {
    Throw::OutOfMemory();
  }
  buffer._0_4_ = length + 1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&char16_t::typeinfo,0,(ulong)(uint)buffer,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
             ,0xe7a);
  this = Memory::Recycler::TrackAllocInfo(recycler,&local_50);
  local_28 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                       ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)(uint)buffer
                       );
  js_wmemcpy_s(local_28,(ulong)(uint)buffer,_bufLen,(ulong)buffer._4_4_);
  local_28[buffer._4_4_] = L'\0';
  return local_28;
}

Assistant:

char16* JavascriptString::AllocateLeafAndCopySz(__in Recycler* recycler, __in_ecount(length) const char16* content, charcount_t length)
    {
        // Note: Intentionally not using SafeSzSize nor hoisting common
        // sub-expression "length + 1" into a local variable otherwise
        // Prefast gets confused and cannot track buffer's length.

        // JavascriptString::MaxCharLength is valid; however, we are incrementing below by 1 and want to make sure we aren't overflowing
        // Nor going outside of valid range.
        if (length >= JavascriptString::MaxCharLength)
        {
            Throw::OutOfMemory();
        }

        charcount_t bufLen = length + 1;
        // Allocate recycler memory to store the string plus a terminating NUL
        char16* buffer = RecyclerNewArrayLeaf(recycler, char16, bufLen);
        js_wmemcpy_s(buffer, bufLen, content, length);
        buffer[length] = _u('\0');

        return buffer;
    }